

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

bool Memory::HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
               (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *block,
               SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *list,
               SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  for (; (list != block && (list != tail));
      list = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(list)) {
  }
  return list != tail;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }